

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

char * deqp::gls::anon_unknown_1::RandomArrayGenerator::generateBasicArray
                 (int seed,int elementCount,int componentCount,int offset,int stride,InputType type)

{
  InputType type_local;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int elementCount_local;
  int seed_local;
  
  switch(type) {
  case INPUTTYPE_FLOAT:
    _elementCount_local =
         gls::(anonymous_namespace)::RandomArrayGenerator::
         createBasicArray<float,deqp::gls::(anonymous_namespace)::GLValue::WrappedType<float>>
                   (seed,elementCount,componentCount,offset,stride);
    break;
  case INPUTTYPE_FIXED:
    _elementCount_local =
         gls::(anonymous_namespace)::RandomArrayGenerator::
         createBasicArray<int,deqp::gls::(anonymous_namespace)::GLValue::Fixed>
                   (seed,elementCount,componentCount,offset,stride);
    break;
  case INPUTTYPE_DOUBLE:
    _elementCount_local =
         gls::(anonymous_namespace)::RandomArrayGenerator::
         createBasicArray<double,deqp::gls::(anonymous_namespace)::GLValue::WrappedType<double>>
                   (seed,elementCount,componentCount,offset,stride);
    break;
  case INPUTTYPE_BYTE:
    _elementCount_local =
         gls::(anonymous_namespace)::RandomArrayGenerator::
         createBasicArray<signed_char,deqp::gls::(anonymous_namespace)::GLValue::WrappedType<signed_char>>
                   (seed,elementCount,componentCount,offset,stride);
    break;
  case INPUTTYPE_SHORT:
    _elementCount_local =
         gls::(anonymous_namespace)::RandomArrayGenerator::
         createBasicArray<short,deqp::gls::(anonymous_namespace)::GLValue::WrappedType<short>>
                   (seed,elementCount,componentCount,offset,stride);
    break;
  case INPUTTYPE_UNSIGNED_BYTE:
    _elementCount_local =
         gls::(anonymous_namespace)::RandomArrayGenerator::
         createBasicArray<unsigned_char,deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_char>>
                   (seed,elementCount,componentCount,offset,stride);
    break;
  case INPUTTYPE_UNSIGNED_SHORT:
    _elementCount_local =
         gls::(anonymous_namespace)::RandomArrayGenerator::
         createBasicArray<unsigned_short,deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_short>>
                   (seed,elementCount,componentCount,offset,stride);
    break;
  case INPUTTYPE_INT:
    _elementCount_local =
         gls::(anonymous_namespace)::RandomArrayGenerator::
         createBasicArray<int,deqp::gls::(anonymous_namespace)::GLValue::WrappedType<int>>
                   (seed,elementCount,componentCount,offset,stride);
    break;
  case INPUTTYPE_UNSIGNED_INT:
    _elementCount_local =
         gls::(anonymous_namespace)::RandomArrayGenerator::
         createBasicArray<unsigned_int,deqp::gls::(anonymous_namespace)::GLValue::WrappedType<unsigned_int>>
                   (seed,elementCount,componentCount,offset,stride);
    break;
  case INPUTTYPE_HALF:
    _elementCount_local =
         gls::(anonymous_namespace)::RandomArrayGenerator::
         createBasicArray<unsigned_short,deqp::gls::(anonymous_namespace)::GLValue::Half>
                   (seed,elementCount,componentCount,offset,stride);
    break;
  default:
    _elementCount_local = (char *)0x0;
  }
  return _elementCount_local;
}

Assistant:

char* RandomArrayGenerator::generateBasicArray (int seed, int elementCount, int componentCount, int offset, int stride, DrawTestSpec::InputType type)
{
	switch (type)
	{
		case DrawTestSpec::INPUTTYPE_FLOAT:				return createBasicArray<float,		GLValue::Float>	(seed, elementCount, componentCount, offset, stride);
		case DrawTestSpec::INPUTTYPE_DOUBLE:			return createBasicArray<double,		GLValue::Double>(seed, elementCount, componentCount, offset, stride);
		case DrawTestSpec::INPUTTYPE_SHORT:				return createBasicArray<deInt16,	GLValue::Short>	(seed, elementCount, componentCount, offset, stride);
		case DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT:	return createBasicArray<deUint16,	GLValue::Ushort>(seed, elementCount, componentCount, offset, stride);
		case DrawTestSpec::INPUTTYPE_BYTE:				return createBasicArray<deInt8,		GLValue::Byte>	(seed, elementCount, componentCount, offset, stride);
		case DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE:		return createBasicArray<deUint8,	GLValue::Ubyte>	(seed, elementCount, componentCount, offset, stride);
		case DrawTestSpec::INPUTTYPE_FIXED:				return createBasicArray<deInt32,	GLValue::Fixed>	(seed, elementCount, componentCount, offset, stride);
		case DrawTestSpec::INPUTTYPE_INT:				return createBasicArray<deInt32,	GLValue::Int>	(seed, elementCount, componentCount, offset, stride);
		case DrawTestSpec::INPUTTYPE_UNSIGNED_INT:		return createBasicArray<deUint32,	GLValue::Uint>	(seed, elementCount, componentCount, offset, stride);
		case DrawTestSpec::INPUTTYPE_HALF:				return createBasicArray<deFloat16,	GLValue::Half>	(seed, elementCount, componentCount, offset, stride);
		default:
			DE_ASSERT(false);
			break;
	}
	return DE_NULL;
}